

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O2

fft_plan *
fft_plan_dft_r2c_1d(fft_plan *__return_storage_ptr__,int n,double *in,fft_complex *out,uint flags)

{
  ulong uVar1;
  double *pdVar2;
  int *ip;
  int nw;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = 0xffffffffffffffff;
  uVar5 = (long)((n * 5) / 4) << 3;
  if (n < 0) {
    uVar5 = uVar1;
  }
  uVar4 = (long)n * 4;
  if (n < 0) {
    uVar4 = uVar1;
  }
  *(undefined8 *)&__return_storage_ptr__->flags = 0;
  __return_storage_ptr__->c_in = (fft_complex *)0x0;
  __return_storage_ptr__->n = n;
  __return_storage_ptr__->in = in;
  __return_storage_ptr__->c_out = out;
  __return_storage_ptr__->sign = 1;
  uVar3 = (long)n << 3;
  if (n < 0) {
    uVar3 = uVar1;
  }
  __return_storage_ptr__->flags = flags;
  __return_storage_ptr__->out = (double *)0x0;
  pdVar2 = (double *)operator_new__(uVar3);
  __return_storage_ptr__->input = pdVar2;
  ip = (int *)operator_new__(uVar4);
  __return_storage_ptr__->ip = ip;
  pdVar2 = (double *)operator_new__(uVar5);
  __return_storage_ptr__->w = pdVar2;
  *ip = 0;
  nw = n >> 2;
  makewt(nw,ip,pdVar2);
  makect(nw,ip,pdVar2 + nw);
  return __return_storage_ptr__;
}

Assistant:

fft_plan fft_plan_dft_r2c_1d(int n, double *in, fft_complex *out,
    unsigned int flags) {
  void makewt(int nw, int *ip, double *w);
  void makect(int nc, int *ip, double *c);

  fft_plan output = {0};
  output.n = n;
  output.in = in;
  output.c_in = NULL;
  output.out = NULL;
  output.c_out = out;
  output.sign = FFT_FORWARD;
  output.flags = flags;
  output.input = new double[n];
  output.ip = new int[n];
  output.w = new double[n * 5 / 4];

  output.ip[0] = 0;
  makewt(output.n >> 2, output.ip, output.w);
  makect(output.n >> 2, output.ip, output.w + (output.n >> 2));
  return output;
}